

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O2

void Fossilize::hash_variant
               (Hasher *h,VariantDependency dep,VkPhysicalDeviceProperties2 *props,
               VkApplicationInfo *info,void *device_pnext,bool feature_hash)

{
  int iVar1;
  uint uVar2;
  VkPhysicalDeviceVulkan12Features *pVVar3;
  char *pcVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  int *piVar8;
  char *str;
  VkStructureType type;
  bool bVar9;
  
  type = (VkStructureType)device_pnext;
  switch(dep) {
  case VendorID:
    if (props == (VkPhysicalDeviceProperties2 *)0x0) break;
    uVar6 = (ulong)(props->properties).vendorID;
    goto LAB_00103915;
  case MutableDescriptorType:
    for (; (int *)device_pnext != (int *)0x0; device_pnext = *(void **)((long)device_pnext + 8)) {
      if (*device_pnext == 0x3ba02518) {
        bVar9 = *(int *)((long)device_pnext + 0x10) != 0;
        if ((!feature_hash) || (*(int *)((long)device_pnext + 0x10) == 0)) goto LAB_00103986;
        uVar6 = h->h * 0x100000001b3 ^ 0x3ba02518;
        goto LAB_00103b4d;
      }
    }
    bVar9 = false;
LAB_00103986:
    if ((feature_hash) && (bVar9 == false)) {
      return;
    }
    uVar6 = h->h;
    goto LAB_00103b4d;
  case BindlessUBO:
    for (; ((int *)device_pnext != (int *)0x0 && (*device_pnext != 0x3b9d3ee9));
        device_pnext = *(void **)((long)device_pnext + 8)) {
    }
    pVVar3 = find_pnext<VkPhysicalDeviceVulkan12Features>
                       (type,&switchD_001036f8::switchdataD_001098f8);
    if (((int *)device_pnext == (int *)0x0) ||
       (bVar9 = true, *(int *)((long)device_pnext + 0x38) == 0)) {
      if (pVVar3 == (VkPhysicalDeviceVulkan12Features *)0x0) {
LAB_00103a7d:
        bVar9 = false;
        goto LAB_00103a7f;
      }
      bVar9 = pVVar3->descriptorBindingUniformBufferUpdateAfterBind != 0;
    }
    if ((feature_hash & bVar9) == 1) {
      uVar6 = (h->h * 0x100000001b3 ^ 0x3b9d3ee9) * 0x100000001b3 ^ 10;
    }
    else {
LAB_00103a7f:
      if ((feature_hash) && (bVar9 == false)) {
        return;
      }
      uVar6 = h->h;
    }
    goto LAB_00103a8f;
  case BufferDeviceAddress:
    for (; ((int *)device_pnext != (int *)0x0 && (*device_pnext != 0x3b9eb5e8));
        device_pnext = *(void **)((long)device_pnext + 8)) {
    }
    pVVar3 = find_pnext<VkPhysicalDeviceVulkan12Features>
                       (type,&switchD_001036f8::switchdataD_001098f8);
    if (((int *)device_pnext == (int *)0x0) ||
       (bVar9 = true, *(int *)((long)device_pnext + 0x10) == 0)) {
      if (pVVar3 == (VkPhysicalDeviceVulkan12Features *)0x0) goto LAB_00103a7d;
      bVar9 = pVVar3->bufferDeviceAddress != 0;
    }
    if ((feature_hash & bVar9) != 1) goto LAB_00103a7f;
    uVar6 = h->h * 0x100000001b3 ^ 0x3b9eb5e8;
LAB_00103a8f:
    uVar6 = uVar6 * 0x100000001b3;
    uVar7 = (ulong)bVar9;
    goto LAB_00103923;
  case ApplicationVersion:
    if (info != (VkApplicationInfo *)0x0) {
      uVar6 = (ulong)info->applicationVersion;
      goto LAB_00103915;
    }
    break;
  case EngineVersion:
    if (info != (VkApplicationInfo *)0x0) {
      uVar6 = (ulong)info->engineVersion;
      goto LAB_00103915;
    }
    break;
  case ApplicationVersionMajor:
    if (info != (VkApplicationInfo *)0x0) {
      uVar2 = info->applicationVersion;
LAB_001038ed:
      uVar6 = (ulong)(uVar2 >> 0x16);
      goto LAB_00103915;
    }
    break;
  case ApplicationVersionMinor:
    if (info != (VkApplicationInfo *)0x0) {
      uVar2 = info->applicationVersion;
LAB_001038fa:
      uVar6 = (ulong)(uVar2 >> 0xc & 0x3ff);
      goto LAB_00103915;
    }
    break;
  case ApplicationVersionPatch:
    if (info != (VkApplicationInfo *)0x0) {
      uVar2 = info->applicationVersion;
LAB_0010390c:
      uVar6 = (ulong)(uVar2 & 0xfff);
      goto LAB_00103915;
    }
    break;
  case EngineVersionMajor:
    if (info != (VkApplicationInfo *)0x0) {
      uVar2 = info->engineVersion;
      goto LAB_001038ed;
    }
    break;
  case EngineVersionMinor:
    if (info != (VkApplicationInfo *)0x0) {
      uVar2 = info->engineVersion;
      goto LAB_001038fa;
    }
    break;
  case EngineVersionPatch:
    if (info != (VkApplicationInfo *)0x0) {
      uVar2 = info->engineVersion;
      goto LAB_0010390c;
    }
    break;
  case ApplicationName:
    if (info != (VkApplicationInfo *)0x0) {
      pcVar4 = info->pApplicationName;
      goto LAB_00103930;
    }
    goto LAB_0010392e;
  case EngineName:
    if (info != (VkApplicationInfo *)0x0) {
      pcVar4 = info->pEngineName;
      goto LAB_00103930;
    }
LAB_0010392e:
    pcVar4 = (char *)0x0;
LAB_00103930:
    str = "";
    if (pcVar4 != (char *)0x0) {
      str = pcVar4;
    }
    Hasher::string(h,str);
    return;
  case FragmentShadingRate:
LAB_00103757:
    if ((int *)device_pnext != (int *)0x0) {
      if (*device_pnext != 0x3b9e3cd3) goto code_r0x0010376d;
      bVar9 = true;
      if ((*(int *)((long)device_pnext + 0x18) == 0) && (*(int *)((long)device_pnext + 0x10) == 0))
      {
        bVar9 = *(int *)((long)device_pnext + 0x14) != 0;
      }
      if ((feature_hash) && (bVar9)) {
        h->h = h->h * 0x100000001b3 ^ 0x3b9e3cd3;
      }
      else if ((~feature_hash & 1U) == 0 && !bVar9) {
        return;
      }
      uVar6 = ((ulong)(*(int *)((long)device_pnext + 0x18) != 0) ^ h->h * 0x100000001b3) *
              0x100000001b3 ^ (ulong)(*(int *)((long)device_pnext + 0x10) != 0);
      iVar1 = *(int *)((long)device_pnext + 0x14);
LAB_00103b04:
      uVar7 = (ulong)(iVar1 != 0);
      goto LAB_00103b07;
    }
    if (feature_hash) {
      return;
    }
    uVar6 = h->h * 0x366000002e329;
    goto LAB_0010396b;
  case DynamicRendering:
    for (piVar5 = (int *)device_pnext; (piVar5 != (int *)0x0 && (*piVar5 != 0x3b9b75e3));
        piVar5 = *(int **)(piVar5 + 2)) {
    }
    for (; (int *)device_pnext != (int *)0x0; device_pnext = *(void **)((long)device_pnext + 8)) {
      if (*device_pnext == 0x35) {
        piVar8 = (int *)device_pnext;
        if (piVar5 != (int *)0x0) goto LAB_00103a1a;
        goto LAB_00103b16;
      }
    }
    piVar8 = (int *)0x0;
    if (piVar5 == (int *)0x0) {
      bVar9 = false;
    }
    else {
LAB_00103a1a:
      bVar9 = piVar5[4] != 0;
      if (((int *)device_pnext != (int *)0x0) && (device_pnext = piVar8, piVar5[4] == 0)) {
LAB_00103b16:
        bVar9 = *(int *)((long)device_pnext + 0x40) != 0;
      }
      if ((feature_hash) && (bVar9 != false)) {
        uVar6 = h->h * 0x100000001b3 ^ 0x3b9b75e3;
        goto LAB_00103b4d;
      }
    }
    if ((feature_hash) && (bVar9 == false)) {
      return;
    }
    uVar6 = h->h;
LAB_00103b4d:
    h->h = (ulong)bVar9 ^ uVar6 * 0x100000001b3;
    return;
  case DescriptorBuffer:
    for (; (int *)device_pnext != (int *)0x0; device_pnext = *(void **)((long)device_pnext + 8)) {
      if (*device_pnext == 0x3b9f9c62) {
        bVar9 = true;
        if (*(int *)((long)device_pnext + 0x10) == 0) {
          bVar9 = *(int *)((long)device_pnext + 0x1c) != 0;
        }
        if ((feature_hash) && (bVar9)) {
          h->h = h->h * 0x100000001b3 ^ 0x3b9f9c62;
        }
        else if ((~feature_hash & 1U) == 0 && !bVar9) {
          return;
        }
        uVar6 = (ulong)(*(int *)((long)device_pnext + 0x10) != 0) ^ h->h * 0x100000001b3;
        iVar1 = *(int *)((long)device_pnext + 0x1c);
        goto LAB_00103b04;
      }
    }
    if (feature_hash) {
      return;
    }
    uVar6 = h->h * 0x100000001b3;
LAB_0010396b:
    uVar7 = 0;
LAB_00103b07:
    uVar7 = uVar6 * 0x100000001b3 ^ uVar7;
    goto LAB_00103926;
  default:
    goto switchD_001036f8_default;
  }
  uVar6 = 0;
LAB_00103915:
  uVar7 = h->h * 0x100000001b3;
LAB_00103923:
  uVar7 = uVar7 ^ uVar6;
LAB_00103926:
  h->h = uVar7;
switchD_001036f8_default:
  return;
code_r0x0010376d:
  device_pnext = *(void **)((long)device_pnext + 8);
  goto LAB_00103757;
}

Assistant:

static void hash_variant(Hasher &h, VariantDependency dep,
                         const VkPhysicalDeviceProperties2 *props,
                         const VkApplicationInfo *info,
                         const void *device_pnext,
                         bool feature_hash)
{
	const VkApplicationInfo default_app_info = { VK_STRUCTURE_TYPE_APPLICATION_INFO };
	bool hash_enabled = true;

	if (!info)
		info = &default_app_info;

	switch (dep)
	{
	case VariantDependency::VendorID:
		h.u32(props ? props->properties.vendorID : 0);
		break;

	case VariantDependency::MutableDescriptorType:
	{
		auto *mut = find_pnext<VkPhysicalDeviceMutableDescriptorTypeFeaturesEXT>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT,
				device_pnext);

		bool enabled = mut && mut->mutableDescriptorType;

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT);
		}

		if (hash_enabled)
			h.u32(uint32_t(enabled));
		break;
	}

	case VariantDependency::BufferDeviceAddress:
	{
		auto *bda = find_pnext<VkPhysicalDeviceBufferDeviceAddressFeatures>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES,
				device_pnext);
		auto *features12 = find_pnext<VkPhysicalDeviceVulkan12Features>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES,
				device_pnext);

		bool enabled = (bda && bda->bufferDeviceAddress) ||
		               (features12 && features12->bufferDeviceAddress);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES);
		}

		if (hash_enabled)
			h.u32(uint32_t(enabled));
		break;
	}

	case VariantDependency::FragmentShadingRate:
	{
		auto *vrs = find_pnext<VkPhysicalDeviceFragmentShadingRateFeaturesKHR>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR, device_pnext);

		bool enabled = vrs && (vrs->attachmentFragmentShadingRate ||
		                       vrs->pipelineFragmentShadingRate ||
		                       vrs->primitiveFragmentShadingRate);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR);
		}

		if (hash_enabled)
		{
			h.u32(uint32_t(vrs && vrs->attachmentFragmentShadingRate));
			h.u32(uint32_t(vrs && vrs->pipelineFragmentShadingRate));
			h.u32(uint32_t(vrs && vrs->primitiveFragmentShadingRate));
		}
		break;
	}

	case VariantDependency::DynamicRendering:
	{
		auto *dynamic_rendering = find_pnext<VkPhysicalDeviceDynamicRenderingFeatures>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_FEATURES, device_pnext);
		auto *features13 = find_pnext<VkPhysicalDeviceVulkan13Features>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_FEATURES, device_pnext);
		bool enabled = (dynamic_rendering && dynamic_rendering->dynamicRendering) ||
		               (features13 && features13->dynamicRendering);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_FEATURES);
		}

		if (hash_enabled)
			h.u32(uint32_t(enabled));
		break;
	}

	case VariantDependency::BindlessUBO:
	{
		auto *indexing = find_pnext<VkPhysicalDeviceDescriptorIndexingFeatures>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES,
				device_pnext);
		auto *features12 = find_pnext<VkPhysicalDeviceVulkan12Features>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES,
				device_pnext);
		bool enabled = (indexing && indexing->descriptorBindingUniformBufferUpdateAfterBind) ||
		               (features12 && features12->descriptorBindingUniformBufferUpdateAfterBind);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
			{
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES);
				// 10th feature element.
				// Just arbitrary to distinguish potential hashing on different
				// sub-features of this struct at some other point.
				h.u32(10);
			}
		}

		if (hash_enabled)
			h.u32(uint32_t(enabled));
		break;
	}

	case VariantDependency::DescriptorBuffer:
	{
		auto *descriptor_buffer = find_pnext<VkPhysicalDeviceDescriptorBufferFeaturesEXT>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT,
				device_pnext);
		bool enabled = descriptor_buffer && (descriptor_buffer->descriptorBuffer ||
		                                     descriptor_buffer->descriptorBufferPushDescriptors);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT);
		}

		if (hash_enabled)
		{
			h.u32(uint32_t(descriptor_buffer && descriptor_buffer->descriptorBuffer));
			h.u32(uint32_t(descriptor_buffer && descriptor_buffer->descriptorBufferPushDescriptors));
			// The other feature bits are highly unlikely to ever affect
			// pipeline construction in application in any meaningful way.
		}
		break;
	}

	case VariantDependency::ApplicationVersion:
		h.u32(info->applicationVersion);
		break;

	case VariantDependency::ApplicationVersionMajor:
		h.u32(VK_VERSION_MAJOR(info->applicationVersion));
		break;

	case VariantDependency::ApplicationVersionMinor:
		h.u32(VK_VERSION_MINOR(info->applicationVersion));
		break;

	case VariantDependency::ApplicationVersionPatch:
		h.u32(VK_VERSION_PATCH(info->applicationVersion));
		break;

	case VariantDependency::EngineVersion:
		h.u32(info->engineVersion);
		break;

	case VariantDependency::EngineVersionMajor:
		h.u32(VK_VERSION_MAJOR(info->engineVersion));
		break;

	case VariantDependency::EngineVersionMinor:
		h.u32(VK_VERSION_MINOR(info->engineVersion));
		break;

	case VariantDependency::EngineVersionPatch:
		h.u32(VK_VERSION_PATCH(info->engineVersion));
		break;

	case VariantDependency::ApplicationName:
		h.string(info->pApplicationName ? info->pApplicationName : "");
		break;

	case VariantDependency::EngineName:
		h.string(info->pEngineName ? info->pEngineName : "");
		break;

	default:
		break;
	}
}